

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CSMFPlay.cpp
# Opt level: O0

void __thiscall dsa::CSMFPlay::Start(CSMFPlay *this,bool reset)

{
  DWORD DVar1;
  reference pvVar2;
  reference pvVar3;
  CSMF_Exception anon_var_0;
  CSMFEvent local_40;
  value_type_conflict local_20;
  int local_1c;
  int local_18;
  int trk;
  int i;
  bool reset_local;
  CSMFPlay *this_local;
  
  trk._3_1_ = reset;
  _i = this;
  if (reset) {
    for (local_18 = 0; local_18 < this->m_mods; local_18 = local_18 + 1) {
      CMIDIModule::Reset((CMIDIModule *)(&this->field_0x30 + (long)local_18 * 0x27e8));
    }
  }
  this->m_tempo = 500000;
  this->m_time_rest = 0.0;
  this->rendered_ticks = 0;
  this->wanted_ticks = 0;
  std::vector<int,_std::allocator<int>_>::clear(&this->m_delta);
  std::vector<bool,_std::allocator<bool>_>::clear(&this->m_end_flag);
  std::vector<dsa::CSMFEvent,_std::allocator<dsa::CSMFEvent>_>::clear(&this->m_event);
  this->m_playing_tracks = (uint)(this->m_smf).m_track_num;
  for (local_1c = 0; local_1c < (int)(uint)(this->m_smf).m_track_num; local_1c = local_1c + 1) {
    CSMF::Seek(&this->m_smf,local_1c,0);
    local_20 = 0;
    std::vector<int,_std::allocator<int>_>::push_back(&this->m_delta,&local_20);
    std::vector<bool,_std::allocator<bool>_>::push_back(&this->m_end_flag,false);
    CSMF::ReadNextEvent(&local_40,&this->m_smf,local_1c);
    std::vector<dsa::CSMFEvent,_std::allocator<dsa::CSMFEvent>_>::push_back
              (&this->m_event,&local_40);
    pvVar2 = std::vector<dsa::CSMFEvent,_std::allocator<dsa::CSMFEvent>_>::operator[]
                       (&this->m_event,(long)local_1c);
    DVar1 = pvVar2->m_delta;
    pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](&this->m_delta,(long)local_1c);
    *pvVar3 = (value_type)DVar1;
  }
  return;
}

Assistant:

void CSMFPlay::Start(bool reset) {

  if (reset) for(int i=0;i<m_mods;i++) m_module[i].Reset();

  m_tempo = (60*1000000)/120;
  m_time_rest = 0.0;

  rendered_ticks = 0;
  wanted_ticks = 0;

  m_delta.clear();
  m_end_flag.clear();
  m_event.clear();

  m_playing_tracks = m_smf.m_track_num;

  for(int trk=0; trk<m_smf.m_track_num; trk++) {
    m_smf.Seek(trk,0);
    m_delta.push_back(0);
    m_end_flag.push_back(false);
    try {
      m_event.push_back(m_smf.ReadNextEvent(trk));
	  m_delta[trk] = m_event[trk].m_delta;
    } catch (CSMF_Exception) {
      m_end_flag[trk] = true;
    }
  }
}